

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,nk_bool *selected,char *hash,int len,int line)

{
  nk_style_selectable *style;
  int *piVar1;
  nk_vec2 nVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *pnVar5;
  nk_hash name;
  int len_00;
  int iVar6;
  nk_widget_layout_states nVar7;
  nk_bool nVar8;
  nk_collapse_states *pnVar9;
  long lVar10;
  nk_uint value;
  char *pcVar11;
  long lVar12;
  nk_command_buffer *b;
  nk_panel *layout;
  nk_context *in;
  float fVar13;
  float fVar14;
  float fVar15;
  nk_rect r;
  nk_rect nVar16;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_flags local_bc;
  nk_rect local_b8;
  float local_a8;
  float local_a4;
  float local_a0;
  nk_flags ws;
  nk_rect local_98;
  nk_bool *local_80;
  nk_panel *local_78;
  undefined8 uStack_70;
  nk_image *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  nk_rect r_00;
  
  local_b8.x = (float)type;
  pnVar3 = ctx->current;
  pcVar11 = title;
  local_80 = selected;
  local_60 = img;
  if (hash == (char *)0x0) {
    len = nk_strlen(title);
    hash = title;
  }
  value = (nk_uint)pcVar11;
  name = nk_murmur_hash(hash,len,line);
  pnVar9 = nk_find_value(pnVar3,name);
  if (pnVar9 == (nk_collapse_states *)0x0) {
    pnVar9 = nk_add_value(ctx,pnVar3,name,value);
    *pnVar9 = initial_state;
  }
  len_00 = nk_strlen(title);
  ws = 0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.w = 0.0;
  local_98.h = 0.0;
  pnVar3 = ctx->current;
  iVar6 = 0;
  if ((pnVar3 != (nk_window *)0x0) && (pnVar4 = pnVar3->layout, pnVar4 != (nk_panel *)0x0)) {
    b = &pnVar3->buffer;
    local_a8 = (ctx->style).window.spacing.x;
    local_a4 = (ctx->style).window.spacing.y;
    local_a0 = (ctx->style).selectable.padding.x;
    fVar13 = (ctx->style).tab.padding.y;
    fVar13 = fVar13 + fVar13 + ((ctx->style).font)->height;
    (pnVar4->row).min_height = fVar13;
    nk_layout_row_dynamic(ctx,fVar13,1);
    nk_layout_reset_min_row_height(ctx);
    nVar7 = nk_widget(&local_98,ctx);
    if (local_b8.x == 1.4013e-45) {
      local_b8.x = local_98.x;
      local_b8.y = local_98.y;
      local_b8.w = 0.0;
      local_b8.h = 0.0;
      if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
        r.w = local_98.w;
        r.h = local_98.h;
        r.x = local_98.x;
        r.y = local_98.y;
        nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
      }
      else {
        local_78 = (nk_panel *)local_98._8_8_;
        uStack_70 = 0;
        nVar16.w = local_98.w;
        nVar16.h = local_98.h;
        nVar16.x = local_98.x;
        nVar16.y = local_98.y;
        nk_fill_rect(b,nVar16,0.0,(ctx->style).tab.border_color);
        r_00._8_8_ = local_78;
        r_00.x = local_b8.x;
        r_00.y = local_b8.y;
        nVar16 = nk_shrink_rect(r_00,(ctx->style).tab.border);
        nk_fill_rect(b,nVar16,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
      }
      lVar10 = 0x17c8;
      lVar12 = 0x1878;
    }
    else {
      lVar10 = 0x1928;
      lVar12 = 0x19d8;
      local_b8.x = local_98.x;
      local_b8.y = local_98.y;
      local_b8.w = 0.0;
      local_b8.h = 0.0;
    }
    in = (nk_context *)0x0;
    if (nVar7 == NK_WIDGET_VALID && (pnVar4->flags & 0x1000) == 0) {
      in = ctx;
    }
    if (*pnVar9 == NK_MAXIMIZED) {
      lVar12 = lVar10;
    }
    pnVar5 = (ctx->style).font;
    fVar13 = pnVar5->height;
    nVar2 = (ctx->style).tab.padding;
    bounds.x = nVar2.x + local_b8.x;
    bounds.y = nVar2.y + local_b8.y;
    fStack_40 = local_b8.w + 0.0;
    fStack_3c = local_b8.h + 0.0;
    local_58 = ZEXT416((uint)fVar13);
    bounds.h = fVar13;
    bounds.w = fVar13;
    local_78 = pnVar4;
    local_48 = bounds.x;
    fStack_44 = bounds.y;
    nVar8 = nk_do_button_symbol(&ws,b,bounds,
                                (&(ctx->style).tab.sym_minimize)[*pnVar9 == NK_MAXIMIZED],
                                NK_BUTTON_DEFAULT,
                                (nk_style_button *)
                                ((long)&(ctx->input).keyboard.keys[0].down + lVar12),&in->input,
                                pnVar5);
    if (nVar8 != 0) {
      *pnVar9 = (uint)(*pnVar9 != NK_MAXIMIZED);
    }
    style = &(ctx->style).selectable;
    local_bc = 0;
    iVar6 = nk_strlen(title);
    pnVar5 = (ctx->style).font;
    fVar14 = (*pnVar5->width)(pnVar5->userdata,pnVar5->height,title,iVar6);
    fVar14 = local_a0 * 4.0 + fVar14;
    fVar13 = local_a8 + (float)local_58._0_4_;
    if (local_a8 + (float)local_58._0_4_ <= local_98.w) {
      fVar13 = local_98.w;
    }
    fVar15 = (float)local_58._0_4_ + local_48 + local_a8;
    fVar13 = fVar13 - (local_a4 + (float)local_58._0_4_ + (ctx->style).tab.indent);
    if (fVar14 <= fVar13) {
      fVar13 = fVar14;
    }
    pnVar5 = (ctx->style).font;
    if (local_60 == (nk_image *)0x0) {
      bounds_01.y = fStack_44;
      bounds_01.x = fVar15;
      bounds_01.h = pnVar5->height;
      bounds_01.w = fVar13;
      nk_do_selectable(&local_bc,b,bounds_01,title,len_00,0x11,local_80,style,&in->input,pnVar5);
    }
    else {
      bounds_00.y = fStack_44;
      bounds_00.x = fVar15;
      bounds_00.h = pnVar5->height;
      bounds_00.w = fVar13;
      nk_do_selectable_image
                (&local_bc,b,bounds_00,title,len_00,0x11,local_80,local_60,style,&in->input,pnVar5);
    }
    iVar6 = 0;
    if (*pnVar9 == NK_MAXIMIZED) {
      fVar13 = (ctx->style).tab.indent;
      local_78->at_x = local_b8.x + (float)*local_78->offset_x + fVar13;
      fVar14 = (local_78->bounds).w;
      fVar15 = fVar13;
      if (fVar13 <= fVar14) {
        fVar15 = fVar14;
      }
      (local_78->bounds).w = fVar15 - (fVar13 + (ctx->style).window.padding.x);
      piVar1 = &(local_78->row).tree_depth;
      *piVar1 = *piVar1 + 1;
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
nk_bool *selected, const char *hash, int len, int line)
{
struct nk_window *win = ctx->current;
int title_len = 0;
nk_hash tree_hash = 0;
nk_uint *state = 0;

/* retrieve tree state from internal widget state tables */
if (!hash) {
title_len = (int)nk_strlen(title);
tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
} else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
state = nk_find_value(win, tree_hash);
if (!state) {
state = nk_add_value(ctx, win, tree_hash, 0);
*state = initial_state;
} return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
nk_strlen(title), (enum nk_collapse_states*)state, selected);
}